

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_view_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitTest_x_iutest_x_PrintStringView_Test::Body(iu_UnitTest_x_iutest_x_PrintStringView_Test *this)

{
  basic_string_view<char,_std::char_traits<char>_> val;
  Fixed *fixed;
  basic_string_view<char,_std::char_traits<char>_> *v;
  iu_string_view view;
  iuCodeMessage local_258;
  string local_228;
  AssertionResult iutest_ar;
  LogChecker ck;
  Fixed local_198;
  
  LogChecker::LogChecker(&ck,"XYZ");
  view._M_len = 3;
  view._M_str = "XYZ";
  iutest::PrintToString<std::basic_string_view<char,std::char_traits<char>>>
            (&local_228,(iutest *)&view,v);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"static_cast<const char*>(ck)","::iutest::PrintToString(view)",
             ck.super_LogCheckerBase.m_str._M_dataplus._M_p,(char *)&local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)view._M_len);
  std::__cxx11::string::~string((string *)&local_228);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
               ,0x5d,iutest_ar.m_message._M_dataplus._M_p);
    local_258._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_258,&local_198);
    std::__cxx11::string::~string((string *)&local_258);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
  val._M_str = view._M_str;
  val._M_len = view._M_len;
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_198,val);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
             ,0x5e,"Succeeded.\n");
  local_258._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_258,fixed);
  std::__cxx11::string::~string((string *)&local_258);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
  LogChecker::~LogChecker(&ck);
  return;
}

Assistant:

IUTEST(UnitTest, PrintStringView)
{
    LogChecker ck("XYZ");
    ::iutest::detail::iu_string_view view = "XYZ";
    IUTEST_PRINTTOSTRING_EQ(ck, view);
    IUTEST_STREAMOUT_CHECK(view);
}